

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

uint parse_hex4(char *str)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  
  cVar1 = *str;
  cVar5 = -0x30;
  cVar6 = -0x30;
  if (((((byte)(cVar1 - 0x30U) < 10) || (cVar6 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
      (cVar6 = -0x57, (byte)(cVar1 + 0x9fU) < 6)) &&
     (((cVar2 = str[1], (byte)(cVar2 - 0x30U) < 10 || (cVar5 = -0x37, (byte)(cVar2 + 0xbfU) < 6)) ||
      (cVar5 = -0x57, (byte)(cVar2 + 0x9fU) < 6)))) {
    cVar3 = str[2];
    cVar7 = -0x30;
    cVar8 = -0x30;
    if (((((byte)(cVar3 - 0x30U) < 10) || (cVar8 = -0x37, (byte)(cVar3 + 0xbfU) < 6)) ||
        (cVar8 = -0x57, (byte)(cVar3 + 0x9fU) < 6)) &&
       (((cVar4 = str[3], (byte)(cVar4 - 0x30U) < 10 || (cVar7 = -0x37, (byte)(cVar4 + 0xbfU) < 6))
        || (cVar7 = -0x57, (byte)(cVar4 + 0x9fU) < 6)))) {
      return (uint)(byte)(cVar4 + cVar7) +
             ((uint)(byte)(cVar3 + cVar8) +
             (uint)(byte)(cVar2 + cVar5) * 0x10 + (uint)(byte)(cVar1 + cVar6) * 0x100) * 0x10;
    }
  }
  return 0;
}

Assistant:

static unsigned parse_hex4(const char *str)
{
	unsigned h=0;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	return h;
}